

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procs.cpp
# Opt level: O2

void chai_procs(ChaiScript *chai)

{
  Proxy_Function_Base *pPVar1;
  _func_shared_ptr<henson::ProcMap> *extraout_RDX;
  _func_void_ProcMap_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *extraout_RDX_00;
  Dispatch_Engine *this;
  allocator local_41;
  Proxy_Function local_40;
  string local_30;
  
  pPVar1 = (Proxy_Function_Base *)operator_new(0x28);
  chaiscript::dispatch::detail::build_param_type_list<std::shared_ptr<henson::ProcMap>>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30,
             (detail *)0x0,extraout_RDX);
  chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)pPVar1,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            ((_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
             &local_30);
  pPVar1->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Base_00321d50;
  std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,void>
            ((__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2> *)
             &local_40,pPVar1);
  std::__cxx11::string::string((string *)&local_30,"ProcMap",&local_41);
  this = &chai->m_engine;
  chaiscript::detail::Dispatch_Engine::add(this,&local_40,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  chaiscript::fun<std::__cxx11::string,henson::ProcMap>((offset_in_ProcMap_to_subr)&local_40);
  std::__cxx11::string::string((string *)&local_30,"group",&local_41);
  chaiscript::detail::Dispatch_Engine::add(this,&local_40,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  chaiscript::fun<int,henson::ProcMap>((offset_in_ProcMap_to_subr)&local_40);
  std::__cxx11::string::string((string *)&local_30,"color",&local_41);
  chaiscript::detail::Dispatch_Engine::add(this,&local_40,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  chaiscript::fun<int,henson::ProcMap>((offset_in_ProcMap_to_subr)&local_40);
  std::__cxx11::string::string((string *)&local_30,"world_rank",&local_41);
  chaiscript::detail::Dispatch_Engine::add(this,&local_40,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  chaiscript::fun<int,henson::ProcMap>((offset_in_ProcMap_to_subr)&local_40);
  std::__cxx11::string::string((string *)&local_30,"local_rank",&local_41);
  chaiscript::detail::Dispatch_Engine::add(this,&local_40,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pPVar1 = (Proxy_Function_Base *)operator_new(0x28);
  chaiscript::dispatch::detail::build_param_type_list<void,henson::ProcMap*,std::__cxx11::string>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30,
             (detail *)0x0,extraout_RDX_00);
  chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)pPVar1,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            ((_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
             &local_30);
  pPVar1->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Base_00321dc8;
  std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,void>
            ((__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2> *)
             &local_40,pPVar1);
  std::__cxx11::string::string((string *)&local_30,"intercomm",&local_41);
  chaiscript::detail::Dispatch_Engine::add(this,&local_40,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  chaiscript::fun<int,henson::ProcMap,std::__cxx11::string_const&>
            ((offset_in_ProcMap_to_subr)&local_40);
  std::__cxx11::string::string((string *)&local_30,"size",&local_41);
  chaiscript::detail::Dispatch_Engine::add(this,&local_40,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void chai_procs(chaiscript::ChaiScript& chai)
{
    // ProcMap
    chai.add(chaiscript::fun([]() { return proc_map; }),                    "ProcMap");
    chai.add(chaiscript::fun(&h::ProcMap::group),                           "group");
    chai.add(chaiscript::fun(&h::ProcMap::color),                           "color");
    chai.add(chaiscript::fun(&h::ProcMap::world_rank),                      "world_rank");
    chai.add(chaiscript::fun(&h::ProcMap::local_rank),                      "local_rank");
    chai.add(chaiscript::fun([](h::ProcMap* pm, std::string to)
                             { pm->intercomm(to); }),                       "intercomm");
    chai.add(chaiscript::fun(&h::ProcMap::size),                            "size");
}